

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O3

_Bool ppc_cpu_tlb_fill_ppc64
                (CPUState *cs,vaddr addr,int size,MMUAccessType access_type,int mmu_idx,_Bool probe,
                uintptr_t retaddr)

{
  byte *pbVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  hwaddr hVar7;
  long lVar8;
  long lVar9;
  char *fmt;
  CPUPPCState_conflict2 *env;
  int access_type_00;
  mmu_ctx_t_conflict local_68;
  
  env = (CPUPPCState_conflict2 *)(cs[1].tb_jmp_cache + 0x359);
  if (cs[3].tb_jmp_cache[0xa72] != (TranslationBlock *)0x0) {
    iVar3 = (*(code *)cs[3].tb_jmp_cache[0xa72])(cs,addr,access_type,mmu_idx);
    goto switchD_00b5b11c_default;
  }
  if (access_type == MMU_INST_FETCH) {
    access_type_00 = 0x10;
    access_type = MMU_DATA_LOAD;
  }
  else {
    access_type_00 = *(int *)(cs[1].tb_jmp_cache + 0x3b0);
  }
  iVar4 = get_physical_address_wtlb(env,&local_68,addr,access_type,access_type_00,mmu_idx);
  if (iVar4 == 0) {
    tlb_set_page_ppc64(cs,addr & 0xfffffffffffff000,local_68.raddr & 0xfffffffffffff000,
                       local_68.prot,mmu_idx,0x1000);
    iVar3 = 0;
    goto switchD_00b5b11c_default;
  }
  iVar3 = iVar4;
  if (-1 < iVar4) goto switchD_00b5b11c_default;
  iVar3 = 1;
  if (access_type_00 == 0x10) {
    switch(iVar4) {
    case -3:
      if (((ulong)cs[3].tb_jmp_cache[0x8d8] & 0xfffffffe) == 8) {
        cs[1].tb_jmp_cache[0x4fa] = (TranslationBlock *)0x0;
      }
    case -4:
      cs->exception_index = 3;
      *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0x10000000;
      break;
    case -2:
      cs->exception_index = 3;
      *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0x8000000;
      break;
    case -1:
      switch(*(undefined4 *)(cs[3].tb_jmp_cache + 0x8d8)) {
      case 2:
        uVar6 = 0x40000;
        lVar8 = 0x29c0;
        lVar9 = 0x29b8;
        iVar3 = 0x4e;
        break;
      case 3:
        cs->exception_index = 0x4e;
LAB_00b5b57c:
        *(int *)(cs[3].tb_jmp_cache + 0x8dd) = local_68.key << 0x13;
        cs[1].tb_jmp_cache[0x890] =
             (TranslationBlock *)
             ((long)*(int *)(cs[1].tb_jmp_cache + 0x4b3) - 1U &
              (long)*(int *)((long)cs[1].tb_jmp_cache + 0x259c) + 1U | addr & 0xfffffffffffffffc);
        cs[1].tb_jmp_cache[0x891] = (TranslationBlock *)(local_68.ptem | 0x80000000);
        goto switchD_00b5b11c_default;
      case 4:
      case 5:
        cs->exception_index = 0xe;
        *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0;
        cs[1].tb_jmp_cache[0x891] = (TranslationBlock *)addr;
LAB_00b5b2dc:
        cs[1].tb_jmp_cache[0x890] = (TranslationBlock *)0x0;
        goto switchD_00b5b11c_default;
      case 6:
switchD_00b5b1cd_caseD_6:
        fmt = "PowerPC in real mode should never raise any MMU exceptions\n";
LAB_00b5b603:
        cpu_abort_ppc64(cs,fmt);
      case 7:
switchD_00b5b1cd_caseD_7:
        fmt = "MPC8xx MMU model is not implemented\n";
        goto LAB_00b5b603;
      case 9:
        booke206_update_mas_tlb_miss(env,addr,2,mmu_idx);
      case 8:
        cs->exception_index = 0xe;
        *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0;
        cs[1].tb_jmp_cache[0x4f9] = (TranslationBlock *)addr;
        cs[1].tb_jmp_cache[0x4fa] = (TranslationBlock *)((ulong)((mmu_idx & 0xfffffffeU) == 8) << 6)
        ;
LAB_00b5b497:
        iVar3 = -1;
        goto switchD_00b5b11c_default;
      default:
switchD_00b5b1cd_default:
        fmt = "Unknown or invalid MMU model\n";
        goto LAB_00b5b603;
      }
      goto LAB_00b5b4b6;
    }
  }
  else {
    if (iVar4 == -4) {
      if (access_type_00 == 0x50) {
        cs->exception_index = 2;
        *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0;
        cs[1].tb_jmp_cache[0x4cf] = (TranslationBlock *)addr;
        if (access_type == MMU_DATA_STORE) {
          cs[1].tb_jmp_cache[0x4ce] = (TranslationBlock *)0x6100000;
        }
        else {
          cs[1].tb_jmp_cache[0x4ce] = (TranslationBlock *)0x4100000;
        }
      }
      else if (access_type_00 == 0x40) {
        cs->exception_index = 2;
        *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0;
        cs[1].tb_jmp_cache[0x4cf] = (TranslationBlock *)addr;
        if (access_type == MMU_DATA_STORE) {
          cs[1].tb_jmp_cache[0x4ce] = (TranslationBlock *)0x6000000;
        }
        else {
          cs[1].tb_jmp_cache[0x4ce] = (TranslationBlock *)0x4000000;
        }
      }
      else {
        if (access_type_00 == 0x30) {
          cs->exception_index = 5;
          *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 1;
        }
        else {
          printf("DSI: invalid exception (%d)\n",0xfffffffc);
          cs->exception_index = 6;
          *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0x21;
        }
        cs[1].tb_jmp_cache[0x4cf] = (TranslationBlock *)addr;
      }
      goto switchD_00b5b11c_default;
    }
    if (iVar4 == -2) {
      cs->exception_index = 2;
      *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0;
      if (*(int *)(cs[3].tb_jmp_cache + 0x8d8) - 8U < 2) {
        cs[1].tb_jmp_cache[0x4f9] = (TranslationBlock *)addr;
        uVar5 = (uint)(access_type != MMU_DATA_LOAD) * 0x800000;
        uVar6 = uVar5 + 0x40;
        if ((mmu_idx & 0xfffffffeU) != 8) {
          uVar6 = uVar5;
        }
        cs[1].tb_jmp_cache[0x4fa] = (TranslationBlock *)(ulong)uVar6;
      }
      else if (*(int *)(cs[3].tb_jmp_cache + 0x8d8) - 4U < 2) {
        cs[1].tb_jmp_cache[0x891] = (TranslationBlock *)addr;
        if (access_type != MMU_DATA_LOAD) {
          pbVar1 = (byte *)((long)cs[1].tb_jmp_cache + 0x4482);
          *pbVar1 = *pbVar1 | 0x80;
        }
      }
      else {
        cs[1].tb_jmp_cache[0x4cf] = (TranslationBlock *)addr;
        if (access_type == MMU_DATA_STORE) {
          cs[1].tb_jmp_cache[0x4ce] = (TranslationBlock *)0xa000000;
        }
        else {
          cs[1].tb_jmp_cache[0x4ce] = (TranslationBlock *)0x8000000;
        }
      }
      goto switchD_00b5b11c_default;
    }
    if (iVar4 != -1) goto switchD_00b5b11c_default;
    switch(*(undefined4 *)(cs[3].tb_jmp_cache + 0x8d8)) {
    case 2:
      iVar3 = (access_type == MMU_DATA_STORE) + 0x4f;
      uVar6 = (uint)(access_type == MMU_DATA_STORE) << 0x10;
      lVar8 = 0x29a0;
      lVar9 = 0x2998;
      break;
    case 3:
      if (access_type == MMU_DATA_STORE) {
        cs->exception_index = 0x50;
      }
      else {
        cs->exception_index = 0x4f;
      }
      goto LAB_00b5b57c;
    case 4:
    case 5:
      cs->exception_index = 0xd;
      *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0;
      cs[1].tb_jmp_cache[0x891] = (TranslationBlock *)addr;
      if (access_type != MMU_DATA_LOAD) {
        cs[1].tb_jmp_cache[0x890] = (TranslationBlock *)0x800000;
        goto switchD_00b5b11c_default;
      }
      goto LAB_00b5b2dc;
    case 6:
      goto switchD_00b5b1cd_caseD_6;
    case 7:
      goto switchD_00b5b1cd_caseD_7;
    case 9:
      booke206_update_mas_tlb_miss(env,addr,access_type,mmu_idx);
    case 8:
      cs->exception_index = 0xd;
      *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0;
      cs[1].tb_jmp_cache[0x4f9] = (TranslationBlock *)addr;
      uVar5 = (uint)(access_type != MMU_DATA_LOAD) * 0x800000;
      uVar6 = uVar5 + 0x40;
      if ((mmu_idx & 0xfffffffeU) != 8) {
        uVar6 = uVar5;
      }
      cs[1].tb_jmp_cache[0x4fa] = (TranslationBlock *)(ulong)uVar6;
      goto LAB_00b5b497;
    default:
      goto switchD_00b5b1cd_default;
    }
LAB_00b5b4b6:
    cs->exception_index = iVar3;
    *(vaddr *)((long)cs[1].tb_jmp_cache + lVar9 + 0x1ac8) = addr;
    *(target_ulong *)((long)cs[1].tb_jmp_cache + lVar8 + 0x1ac8) = local_68.ptem | 0x80000000;
    *(uint *)(cs[3].tb_jmp_cache + 0x8dd) = local_68.key << 0x13 | uVar6;
    uVar2 = *(ushort *)((long)cs[1].tb_jmp_cache + 0x26aa);
    hVar7 = get_pteg_offset32_ppc64((PowerPCCPU_conflict3 *)cs,local_68.hash[0]);
    cs[1].tb_jmp_cache[0x88e] = (TranslationBlock *)(hVar7 + (ulong)uVar2 * 0x10000);
    uVar2 = *(ushort *)((long)cs[1].tb_jmp_cache + 0x26aa);
    hVar7 = get_pteg_offset32_ppc64((PowerPCCPU_conflict3 *)cs,local_68.hash[1]);
    cs[1].tb_jmp_cache[0x88f] = (TranslationBlock *)(hVar7 + (ulong)uVar2 * 0x10000);
    iVar3 = 1;
  }
switchD_00b5b11c_default:
  if ((iVar3 != 0) && (!probe)) {
    raise_exception_err_ra_ppc64
              (env,cs->exception_index,*(uint32_t *)(cs[3].tb_jmp_cache + 0x8dd),retaddr);
  }
  return iVar3 == 0;
}

Assistant:

bool ppc_cpu_tlb_fill(CPUState *cs, vaddr addr, int size,
                      MMUAccessType access_type, int mmu_idx,
                      bool probe, uintptr_t retaddr)
{
    PowerPCCPU *cpu = POWERPC_CPU(cs);
    PowerPCCPUClass *pcc = POWERPC_CPU_GET_CLASS(cs);
    CPUPPCState *env = &cpu->env;
    int ret;

    if (pcc->handle_mmu_fault) {
        ret = pcc->handle_mmu_fault(cpu, addr, access_type, mmu_idx);
    } else {
        ret = cpu_ppc_handle_mmu_fault(env, addr, access_type, mmu_idx);
    }
    if (unlikely(ret != 0)) {
        if (probe) {
            return false;
        }
        raise_exception_err_ra(env, cs->exception_index, env->error_code,
                               retaddr);
    }
    return true;
}